

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O3

bool from_issue_429::test_uintwide_t_spot_values_from_issue_429(void)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong total_bits_to_use;
  local_input_iterator_type non_const_first;
  pointer puVar5;
  bool bVar6;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> export_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  string str_local;
  stringstream strm_local;
  allocator_type local_251;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_250;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  uintwide_t<256U,_unsigned_int,_void,_false> local_1e8;
  uchar local_1c8 [32];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  basic_ostream<char,_std::char_traits<char>_> local_198;
  undefined7 uStack_197;
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  local_1a8 = 0xffffffffff000000;
  uStack_1a0 = 0xffffffff6221ffff;
  local_198 = (basic_ostream<char,_std::char_traits<char>_>)0x21;
  __l._M_len = 0x11;
  __l._M_array = (iterator)&local_1a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_238,__l,(allocator_type *)&local_1e8);
  uVar4 = ((long)local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
          (long)local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) * 8;
  if (0xff < (long)uVar4) {
    uVar4 = 0x100;
  }
  local_1e8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
  local_1e8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
  local_1e8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
  local_1e8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
  total_bits_to_use = 0;
  if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    total_bits_to_use = uVar4;
  }
  local_1e8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
  local_1e8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
  local_1e8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
  local_1e8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
  math::wide_integer::detail::
  import_export_helper<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,math::wide_integer::detail::iterator_detail::reverse_iterator<unsigned_int*>>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (reverse_iterator<unsigned_int_*>)
             (local_1e8.values.super_array<unsigned_int,_8UL>.elems +
             (total_bits_to_use >> 5) + (ulong)((total_bits_to_use & 0x18) != 0)),total_bits_to_use,
             8,0x20);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  lVar1 = *(long *)(CONCAT71(uStack_197,local_198) + -0x18);
  *(uint *)((long)auStack_180 + lVar1) = *(uint *)((long)auStack_180 + lVar1) & 0xffffffb5 | 8;
  math::wide_integer::operator<<(&local_198,&local_1e8);
  std::__cxx11::stringbuf::str();
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_208,"ffffffffffffff2162ffffffff21");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_250,
             (long)local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(allocator_type *)&local_220);
  math::wide_integer::
  export_bits<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_256U,_unsigned_int,_void,_false,_nullptr>
            (&local_1e8,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,8,true);
  local_1c8[0] = 0xff;
  local_1c8[1] = 0xff;
  local_1c8[2] = 0xff;
  local_1c8[3] = 0xff;
  local_1c8[4] = 0xff;
  local_1c8[5] = 0xff;
  local_1c8[6] = 0xff;
  local_1c8[7] = '!';
  local_1c8[8] = 'b';
  local_1c8[9] = 0xff;
  local_1c8[10] = 0xff;
  local_1c8[0xb] = 0xff;
  local_1c8[0xc] = 0xff;
  local_1c8[0xd] = '!';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  local_1c8[0x10] = 0;
  __l_00._M_len = 0x11;
  __l_00._M_array = local_1c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_220,__l_00,&local_251);
  puVar5 = local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar6 = true;
    }
    else {
      iVar3 = bcmp(local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar6 = iVar3 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if (local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_220.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_220.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    puVar5 = local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (puVar5 != (uchar *)0x0) {
    operator_delete(puVar5,(long)local_250.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
  std::ios_base::~ios_base(local_128);
  if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)(iVar2 == 0 & bVar6);
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_429() -> bool
  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint_type = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint256_t;
    #else
    using local_uint_type = ::math::wide_integer::uint256_t;
    #endif

    const std::vector<std::uint8_t>
      input
      (
        {
          0x00, 0x00, 0x00, 0xff,
          0xff, 0xff, 0xff, 0xff,
          0xff, 0xff, 0x21, 0x62,
          0xff, 0xff, 0xff, 0xff,
          0x21
        }
    );

    local_uint_type p0_local { };

    // Import the data into the wide integer.
    import_bits
    (
      p0_local,
      input.cbegin(),
      input.cend(),
      static_cast<unsigned>(UINT8_C(8))
    );

    std::stringstream strm_local { };

    strm_local << std::hex << p0_local;

    const std::string str_local { strm_local.str() };

    const bool result_import_is_ok { str_local == "ffffffffffffff2162ffffffff21" };

    std::vector<std::uint8_t> export_local(input.size());

    export_bits(p0_local, export_local.begin(), static_cast<unsigned>(UINT8_C(8)));

    const bool result_export_is_ok
    {
      export_local == std::vector<std::uint8_t>( { 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x21, 0x62, 0xff, 0xff, 0xff, 0xff, 0x21, 0x00, 0x00, 0x00 } )
    };

    const bool result_import_export_is_ok { result_import_is_ok && result_export_is_ok };

    return result_import_export_is_ok;
  }